

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::ReadArray<tinyusdz::Payload>
          (CrateReader *this,vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *d)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  uint64_t n;
  uint32_t _n;
  ostringstream ss_e;
  uint32_t shapesize;
  uint64_t local_200;
  uint local_1f4;
  long *local_1f0;
  long local_1e0 [2];
  undefined1 local_1d0 [112];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Alloc_hider local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  bool local_d0;
  storage_t<tinyusdz::Path::PathType> local_cc;
  bool local_c8;
  double local_c0;
  double dStack_b8;
  CrateReader *local_58;
  uint32_t local_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (d == (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)0x0) {
    return false;
  }
  local_200 = 0;
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar2 = StreamReader::read4(this->_sr,&local_4c);
    if (bVar2) {
      bVar2 = StreamReader::read4(this->_sr,&local_1f4);
      if (bVar2) {
        local_200 = (uint64_t)local_1f4;
        goto LAB_001d1799;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"ReadArray",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"():",3);
      iVar6 = 0x612;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"ReadArray",9);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"():",3);
      iVar6 = 0x60d;
    }
  }
  else {
    bVar2 = StreamReader::read8(this->_sr,&local_200);
    if (bVar2) {
LAB_001d1799:
      if ((this->_config).maxArrayElements < local_200) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"ReadArray",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1d0,0x61d);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        pcVar7 = "Too many array elements.";
        lVar5 = 0x18;
      }
      else {
        uVar4 = local_200 * 0x120 + this->_memoryUsage;
        this->_memoryUsage = uVar4;
        if (uVar4 <= (this->_config).maxMemoryBudget) {
          if (local_200 == 0) {
            return true;
          }
          pcVar1 = local_1d0 + 0xf0;
          local_48 = 0;
          uStack_44 = 0;
          uStack_40 = 0;
          uStack_3c = 0x3ff00000;
          uVar4 = 0;
          local_58 = this;
          do {
            local_1d0._0_8_ = local_1d0 + 0x10;
            local_1d0._8_8_ = 0;
            local_1d0[0x10] = '\0';
            local_1d0._32_8_ = local_1d0 + 0x30;
            local_1d0._40_8_ = 0;
            local_1d0[0x30] = '\0';
            local_1d0._64_8_ = local_1d0 + 0x50;
            local_1d0._72_8_ = 0;
            local_1d0[0x50] = '\0';
            local_1d0._96_8_ = local_1d0 + 0x70;
            local_1d0._104_8_ = 0;
            local_160._M_local_buf[0] = '\0';
            local_150._M_p = local_1d0 + 0x90;
            local_148 = 0;
            local_140._M_local_buf[0] = '\0';
            local_130._M_p = local_1d0 + 0xb0;
            local_128 = 0;
            local_120._M_local_buf[0] = '\0';
            local_110._M_p = local_1d0 + 0xd0;
            local_108 = 0;
            local_100._M_local_buf[0] = '\0';
            local_e8 = 0;
            local_e0._M_local_buf[0] = '\0';
            local_d0 = false;
            local_cc = (storage_t<tinyusdz::Path::PathType>)0x0;
            local_c8 = false;
            local_c0 = (double)CONCAT44(uStack_44,local_48);
            dStack_b8 = (double)CONCAT44(uStack_3c,uStack_40);
            local_f0._M_p = pcVar1;
            bVar2 = ReadPayload(local_58,(Payload *)local_1d0);
            if (!bVar2) {
              if (local_f0._M_p != pcVar1) {
                operator_delete(local_f0._M_p,
                                CONCAT71(local_e0._M_allocated_capacity._1_7_,
                                         local_e0._M_local_buf[0]) + 1);
              }
              if (local_110._M_p != local_1d0 + 0xd0) {
                operator_delete(local_110._M_p,
                                CONCAT71(local_100._M_allocated_capacity._1_7_,
                                         local_100._M_local_buf[0]) + 1);
              }
              if (local_130._M_p != local_1d0 + 0xb0) {
                operator_delete(local_130._M_p,
                                CONCAT71(local_120._M_allocated_capacity._1_7_,
                                         local_120._M_local_buf[0]) + 1);
              }
              if (local_150._M_p != local_1d0 + 0x90) {
                operator_delete(local_150._M_p,
                                CONCAT71(local_140._M_allocated_capacity._1_7_,
                                         local_140._M_local_buf[0]) + 1);
              }
              if ((undefined1 *)local_1d0._96_8_ != local_1d0 + 0x70) {
                operator_delete((void *)local_1d0._96_8_,
                                CONCAT71(local_160._M_allocated_capacity._1_7_,
                                         local_160._M_local_buf[0]) + 1);
              }
              if ((undefined1 *)local_1d0._64_8_ != local_1d0 + 0x50) {
                operator_delete((void *)local_1d0._64_8_,
                                CONCAT71(local_1d0._81_7_,local_1d0[0x50]) + 1);
              }
              if ((undefined1 *)local_1d0._32_8_ != local_1d0 + 0x30) {
                operator_delete((void *)local_1d0._32_8_,
                                CONCAT71(local_1d0._49_7_,local_1d0[0x30]) + 1);
              }
              if ((undefined1 *)local_1d0._0_8_ == local_1d0 + 0x10) {
                return false;
              }
              operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1
                             );
              return false;
            }
            ::std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>::
            emplace_back<tinyusdz::Payload&>
                      ((vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>> *)d,
                       (Payload *)local_1d0);
            if (local_f0._M_p != pcVar1) {
              operator_delete(local_f0._M_p,
                              CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]
                                      ) + 1);
            }
            if (local_110._M_p != local_1d0 + 0xd0) {
              operator_delete(local_110._M_p,
                              CONCAT71(local_100._M_allocated_capacity._1_7_,
                                       local_100._M_local_buf[0]) + 1);
            }
            if (local_130._M_p != local_1d0 + 0xb0) {
              operator_delete(local_130._M_p,
                              CONCAT71(local_120._M_allocated_capacity._1_7_,
                                       local_120._M_local_buf[0]) + 1);
            }
            if (local_150._M_p != local_1d0 + 0x90) {
              operator_delete(local_150._M_p,
                              CONCAT71(local_140._M_allocated_capacity._1_7_,
                                       local_140._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_1d0._96_8_ != local_1d0 + 0x70) {
              operator_delete((void *)local_1d0._96_8_,
                              CONCAT71(local_160._M_allocated_capacity._1_7_,
                                       local_160._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_1d0._64_8_ != local_1d0 + 0x50) {
              operator_delete((void *)local_1d0._64_8_,
                              CONCAT71(local_1d0._81_7_,local_1d0[0x50]) + 1);
            }
            if ((undefined1 *)local_1d0._32_8_ != local_1d0 + 0x30) {
              operator_delete((void *)local_1d0._32_8_,
                              CONCAT71(local_1d0._49_7_,local_1d0[0x30]) + 1);
            }
            if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
              operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1
                             );
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 < local_200);
          return true;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"ReadArray",9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1d0,0x620);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        pcVar7 = "Reached to max memory budget.";
        lVar5 = 0x1d;
      }
      goto LAB_001d1af9;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"ReadArray",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"():",3);
    iVar6 = 0x617;
  }
  poVar3 = (ostream *)::std::ostream::operator<<(local_1d0,iVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  pcVar7 = "Failed to read the number of array elements.";
  lVar5 = 0x2c;
LAB_001d1af9:
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,pcVar7,lVar5);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"\n",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1f0);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  ::std::ios_base::~ios_base((ios_base *)(local_1d0 + 0x70));
  return false;
}

Assistant:

bool CrateReader::ReadArray(std::vector<Payload> *d) {

  if (!d) {
    return false;
  }

  uint64_t n{0};
  if (VERSION_LESS_THAN_0_8_0(_version)) {
    uint32_t shapesize; // not used
    if (!_sr->read4(&shapesize)) {
      PUSH_ERROR("Failed to read the number of array elements.");
      return false;
    }
    uint32_t _n;
    if (!_sr->read4(&_n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    }
    n = _n;
  } else {
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }
  }

  if (n > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  CHECK_MEMORY_USAGE(sizeof(Payload) * n);

  for (size_t i = 0; i < n; i++) {
    Payload p;
    if (!ReadPayload(&p)) {
      return false;
    }
    d->emplace_back(p);
  }

  return true;
}